

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O0

png_uint_32
png_get_iCCP(png_const_structrp png_ptr,png_inforp info_ptr,png_charpp name,int *compression_type,
            png_bytepp profile,png_uint_32 *proflen)

{
  png_uint_32 *proflen_local;
  png_bytepp profile_local;
  int *compression_type_local;
  png_charpp name_local;
  png_inforp info_ptr_local;
  png_const_structrp png_ptr_local;
  
  if ((((png_ptr == (png_const_structrp)0x0) || (info_ptr == (png_inforp)0x0)) ||
      ((info_ptr->valid & 0x1000) == 0)) ||
     (((name == (png_charpp)0x0 || (profile == (png_bytepp)0x0)) || (proflen == (png_uint_32 *)0x0))
     )) {
    png_ptr_local._4_4_ = 0;
  }
  else {
    *name = info_ptr->iccp_name;
    *profile = info_ptr->iccp_profile;
    *proflen = (uint)*info_ptr->iccp_profile * 0x1000000 + (uint)info_ptr->iccp_profile[1] * 0x10000
               + (uint)info_ptr->iccp_profile[2] * 0x100 + (uint)info_ptr->iccp_profile[3];
    if (compression_type != (int *)0x0) {
      *compression_type = 0;
    }
    png_ptr_local._4_4_ = 0x1000;
  }
  return png_ptr_local._4_4_;
}

Assistant:

png_uint_32 PNGAPI
png_get_iCCP(png_const_structrp png_ptr, png_inforp info_ptr,
    png_charpp name, int *compression_type,
    png_bytepp profile, png_uint_32 *proflen)
{
   png_debug1(1, "in %s retrieval function", "iCCP");

   if (png_ptr != NULL && info_ptr != NULL &&
       (info_ptr->valid & PNG_INFO_iCCP) != 0 &&
       name != NULL && profile != NULL && proflen != NULL)
   {
      *name = info_ptr->iccp_name;
      *profile = info_ptr->iccp_profile;
      *proflen = png_get_uint_32(info_ptr->iccp_profile);
      /* This is somewhat irrelevant since the profile data returned has
       * actually been uncompressed.
       */
      if (compression_type != NULL)
         *compression_type = PNG_COMPRESSION_TYPE_BASE;
      return PNG_INFO_iCCP;
   }

   return 0;

}